

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

void Sfm_LibPrint(Sfm_Lib_t *p)

{
  word *pTruth;
  int iVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  Sfm_Fun_t *pObj;
  int iVar10;
  ulong uVar11;
  word *pwVar12;
  int iVar13;
  ulong uVar14;
  word *pwVar15;
  int nVarsInit;
  word *tLimit;
  
  pVVar3 = p->vTtMem;
  if (0 < pVVar3->nEntries) {
    uVar8 = 0;
    do {
      if (pVVar3->ppPages[(uint)uVar8 >> ((byte)pVVar3->LogPageSze & 0x1f)] == (word *)0x0) {
        return;
      }
      if (1 < uVar8) {
        if ((long)(p->vHits).nSize <= (long)uVar8) {
LAB_0052e643:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((p->vHits).pArray[uVar8] != 0) {
          pTruth = pVVar3->ppPages[(uint)uVar8 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                   (int)((pVVar3->PageMask & (uint)uVar8) * pVVar3->nEntrySize);
          iVar1 = p->nVars;
          if ((long)iVar1 < 1) {
            nVarsInit = 0;
          }
          else {
            iVar13 = iVar1 + -6;
            uVar6 = 1 << ((byte)iVar13 & 0x1f);
            uVar2 = uVar6;
            if ((int)uVar6 < 2) {
              uVar2 = 1;
            }
            uVar7 = 0;
            nVarsInit = 0;
            do {
              if (iVar1 < 7) {
                uVar9 = (uint)((s_Truths6Neg[uVar7] &
                               (*pTruth >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f) ^ *pTruth)) !=
                              0);
              }
              else {
                uVar9 = 0;
                if (uVar7 < 6) {
                  if (iVar13 != 0x1f) {
                    uVar14 = 0;
                    do {
                      if (((pTruth[uVar14] >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f) ^
                           pTruth[uVar14]) & s_Truths6Neg[uVar7]) != 0) {
                        uVar9 = 1;
                        break;
                      }
                      uVar14 = uVar14 + 1;
                      uVar9 = 0;
                    } while (uVar2 != uVar14);
                  }
                }
                else if (iVar13 != 0x1f) {
                  bVar5 = (byte)(uVar7 - 6);
                  uVar9 = 1 << (bVar5 & 0x1f);
                  iVar10 = 2 << (bVar5 & 0x1f);
                  uVar14 = 1;
                  if (1 < (int)uVar9) {
                    uVar14 = (ulong)uVar9;
                  }
                  pwVar12 = pTruth + (int)uVar9;
                  pwVar15 = pTruth;
                  do {
                    if (uVar7 - 6 != 0x1f) {
                      uVar11 = 0;
                      do {
                        if (pwVar15[uVar11] != pwVar12[uVar11]) {
                          uVar9 = 1;
                          goto LAB_0052e568;
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar14 != uVar11);
                    }
                    pwVar15 = pwVar15 + iVar10;
                    pwVar12 = pwVar12 + iVar10;
                    uVar9 = 0;
                  } while (pwVar15 < pTruth + (int)uVar6);
                }
              }
LAB_0052e568:
              nVarsInit = nVarsInit + uVar9;
              uVar7 = uVar7 + 1;
            } while (uVar7 != (long)iVar1);
          }
          printf("%8d : ",uVar8 & 0xffffffff);
          if ((((long)(p->vCounts).nSize <= (long)uVar8) ||
              (printf("Num =%5d  ",(ulong)(uint)(p->vCounts).pArray[uVar8]),
              (long)(p->vHits).nSize <= (long)uVar8)) ||
             (printf("Hit =%4d  "), (long)(p->vLists).nSize <= (long)uVar8)) goto LAB_0052e643;
          lVar4 = (long)(p->vLists).pArray[uVar8];
          if (lVar4 == -1) {
            pObj = (Sfm_Fun_t *)0x0;
          }
          else {
            pObj = p->pObjs + lVar4;
          }
          if (pObj != (Sfm_Fun_t *)0x0) {
            Sfm_LibPrintObj(p,pObj);
          }
          printf("    ");
          Dau_DsdPrintFromTruth(pTruth,nVarsInit);
        }
      }
      uVar8 = uVar8 + 1;
      pVVar3 = p->vTtMem;
    } while ((long)uVar8 < (long)pVVar3->nEntries);
  }
  return;
}

Assistant:

void Sfm_LibPrint( Sfm_Lib_t * p )
{
    Sfm_Fun_t * pObj; word * pTruth; int i, nFanins;   
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
    {
        if ( i < 2 || Vec_IntEntry(&p->vHits, i) == 0 )
            continue;
        nFanins = Abc_TtSupportSize(pTruth, p->nVars);
        printf( "%8d : ", i );
        printf( "Num =%5d  ", Vec_IntEntry(&p->vCounts, i) );
        printf( "Hit =%4d  ", Vec_IntEntry(&p->vHits, i) );
        Sfm_LibForEachSuper( p, pObj, i )
        {
            Sfm_LibPrintObj( p, pObj );
            break;
        }
        printf( "    " );
        Dau_DsdPrintFromTruth( pTruth, nFanins );
    }
}